

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IncompleteCubeEmptyObjectCase::createTexture
          (IncompleteCubeEmptyObjectCase *this)

{
  GLenum err;
  GLuint in_register_00000004;
  GLuint texture;
  
  texture = in_register_00000004;
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x399);
  return;
}

Assistant:

void IncompleteCubeEmptyObjectCase::createTexture (void)
{
	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_CHECK_MSG("Set texturing state");
}